

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O0

float Nwk_NodePropagateRequired(Nwk_Obj_t *pObj,int fUseSorting)

{
  If_LibLut_t *pIVar1;
  int iVar2;
  Nwk_Obj_t *pNVar3;
  bool bVar4;
  float fVar5;
  int local_144;
  int k;
  float *pDelays;
  Nwk_Obj_t *pNStack_130;
  float tRequired;
  Nwk_Obj_t *pFanin;
  float pPinDelays [32];
  int pPinPerm [32];
  If_LibLut_t *pLutLib;
  int fUseSorting_local;
  Nwk_Obj_t *pObj_local;
  
  pIVar1 = pObj->pMan->pLutLib;
  pDelays._4_4_ = 0.0;
  iVar2 = Nwk_ObjIsNode(pObj);
  if (iVar2 == 0) {
    __assert_fail("Nwk_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkTiming.c"
                  ,0x111,"float Nwk_NodePropagateRequired(Nwk_Obj_t *, int)");
  }
  if (pIVar1 == (If_LibLut_t *)0x0) {
    fVar5 = Nwk_ObjRequired(pObj);
    pDelays._4_4_ = fVar5 - 1.0;
    local_144 = 0;
    while( true ) {
      bVar4 = false;
      if (local_144 < pObj->nFanins) {
        pNStack_130 = pObj->pFanio[local_144];
        bVar4 = pNStack_130 != (Nwk_Obj_t *)0x0;
      }
      if (!bVar4) break;
      fVar5 = Nwk_ObjRequired(pNStack_130);
      if (pDelays._4_4_ < fVar5) {
        Nwk_ObjSetRequired(pNStack_130,pDelays._4_4_);
      }
      local_144 = local_144 + 1;
    }
  }
  else if (pIVar1->fVarPinDelays == 0) {
    iVar2 = Nwk_ObjFaninNum(pObj);
    fVar5 = Nwk_ObjRequired(pObj);
    pDelays._4_4_ = fVar5 - pIVar1->pLutDelays[iVar2][0];
    local_144 = 0;
    while( true ) {
      bVar4 = false;
      if (local_144 < pObj->nFanins) {
        pNStack_130 = pObj->pFanio[local_144];
        bVar4 = pNStack_130 != (Nwk_Obj_t *)0x0;
      }
      if (!bVar4) break;
      fVar5 = Nwk_ObjRequired(pNStack_130);
      if (pDelays._4_4_ < fVar5) {
        Nwk_ObjSetRequired(pNStack_130,pDelays._4_4_);
      }
      local_144 = local_144 + 1;
    }
  }
  else {
    iVar2 = Nwk_ObjFaninNum(pObj);
    if (fUseSorting == 0) {
      local_144 = 0;
      while( true ) {
        bVar4 = false;
        if (local_144 < pObj->nFanins) {
          pNStack_130 = pObj->pFanio[local_144];
          bVar4 = pNStack_130 != (Nwk_Obj_t *)0x0;
        }
        if (!bVar4) break;
        fVar5 = Nwk_ObjRequired(pObj);
        pDelays._4_4_ = fVar5 - pIVar1->pLutDelays[iVar2][local_144];
        fVar5 = Nwk_ObjRequired(pNStack_130);
        if (pDelays._4_4_ < fVar5) {
          Nwk_ObjSetRequired(pNStack_130,pDelays._4_4_);
        }
        local_144 = local_144 + 1;
      }
    }
    else {
      Nwk_ManDelayTraceSortPins(pObj,(int *)(pPinDelays + 0x1e),(float *)&pFanin);
      local_144 = 0;
      while( true ) {
        bVar4 = false;
        if (local_144 < pObj->nFanins) {
          bVar4 = pObj->pFanio[local_144] != (Nwk_Obj_t *)0x0;
        }
        if (!bVar4) break;
        fVar5 = Nwk_ObjRequired(pObj);
        pDelays._4_4_ = fVar5 - pIVar1->pLutDelays[iVar2][local_144];
        pNVar3 = Nwk_ObjFanin(pObj,(int)pPinDelays[(long)local_144 + 0x1e]);
        fVar5 = Nwk_ObjRequired(pNVar3);
        if (pDelays._4_4_ < fVar5) {
          pNVar3 = Nwk_ObjFanin(pObj,(int)pPinDelays[(long)local_144 + 0x1e]);
          Nwk_ObjSetRequired(pNVar3,pDelays._4_4_);
        }
        local_144 = local_144 + 1;
      }
    }
  }
  return pDelays._4_4_;
}

Assistant:

float Nwk_NodePropagateRequired( Nwk_Obj_t * pObj, int fUseSorting )
{
    If_LibLut_t * pLutLib = pObj->pMan->pLutLib;
    int pPinPerm[32];
    float pPinDelays[32];
    Nwk_Obj_t * pFanin;
    float tRequired = 0.0; // Suppress "might be used uninitialized"
    float * pDelays;
    int k;
    assert( Nwk_ObjIsNode(pObj) );
    if ( pLutLib == NULL )
    {
        tRequired = Nwk_ObjRequired(pObj) - (float)1.0;
        Nwk_ObjForEachFanin( pObj, pFanin, k )
            if ( Nwk_ObjRequired(pFanin) > tRequired )
                Nwk_ObjSetRequired( pFanin, tRequired );
    }
    else if ( !pLutLib->fVarPinDelays )
    {
        pDelays = pLutLib->pLutDelays[Nwk_ObjFaninNum(pObj)];
        tRequired = Nwk_ObjRequired(pObj) - pDelays[0];
        Nwk_ObjForEachFanin( pObj, pFanin, k )
            if ( Nwk_ObjRequired(pFanin) > tRequired )
                Nwk_ObjSetRequired( pFanin, tRequired );
    }
    else 
    {
        pDelays = pLutLib->pLutDelays[Nwk_ObjFaninNum(pObj)];
        if ( fUseSorting )
        {
            Nwk_ManDelayTraceSortPins( pObj, pPinPerm, pPinDelays );
            Nwk_ObjForEachFanin( pObj, pFanin, k )
            {
                tRequired = Nwk_ObjRequired(pObj) - pDelays[k];
                if ( Nwk_ObjRequired(Nwk_ObjFanin(pObj,pPinPerm[k])) > tRequired )
                    Nwk_ObjSetRequired( Nwk_ObjFanin(pObj,pPinPerm[k]), tRequired );
            }
        }
        else
        {
            Nwk_ObjForEachFanin( pObj, pFanin, k )
            {
                tRequired = Nwk_ObjRequired(pObj) - pDelays[k];
                if ( Nwk_ObjRequired(pFanin) > tRequired )
                    Nwk_ObjSetRequired( pFanin, tRequired );
            }
        }
    }
    return tRequired;
}